

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_(TimeInMillis ms)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  tm time_struct;
  tm *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  time_t in_stack_fffffffffffffda0;
  allocator *paVar2;
  string local_248 [16];
  undefined8 in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  int local_1a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [12];
  int in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_49 [21];
  int local_34;
  
  bVar1 = PortableLocaltime(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (bVar1) {
    local_1a4 = local_34 + 0x76c;
    __lhs = &local_1a0;
    StreamableToString<int>((int *)in_stack_fffffffffffffdc8);
    std::operator+(&local_180,__lhs,"-");
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(&local_160,&local_180,&local_1c8);
    std::operator+(&local_140,&local_160,"-");
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(&local_120,&local_140,&local_1e8);
    std::operator+(&local_100,&local_120,"T");
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(&local_e0,&local_100,&local_208);
    std::operator+(&local_c0,&local_e0,":");
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_c0,&local_228);
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,":"
                  );
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff6c);
    std::operator+(in_RDI,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  else {
    paVar2 = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  return in_RDI;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}